

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O1

void __thiscall
RandomizerOptions::RandomizerOptions
          (RandomizerOptions *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *spawn_location_names)

{
  _Rb_tree_header *p_Var1;
  Json *pJVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ArgumentDictionary *this_00;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  size_type sVar8;
  void *pvVar9;
  ostream *poVar10;
  LandstalkerException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t sVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  long lVar16;
  string preset_path;
  Json preset_json;
  string permalink_string;
  ifstream preset_file;
  string local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2e8;
  string local_2e0;
  Json *local_2c0;
  Json *local_2b8;
  Json *local_2b0;
  Json *local_2a8;
  ArgumentDictionary *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  string local_238;
  byte abStack_218 [488];
  
  p_Var1 = &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_goal = '\0';
  this->_jewel_count = '\x02';
  this->_use_armor_upgrades = true;
  this->_starting_life = '\0';
  this->_starting_gold = 0;
  (this->_starting_items)._M_elems[0] = '\0';
  (this->_starting_items)._M_elems[1] = '\0';
  (this->_starting_items)._M_elems[2] = '\0';
  (this->_starting_items)._M_elems[3] = '\0';
  (this->_starting_items)._M_elems[4] = '\0';
  (this->_starting_items)._M_elems[5] = '\0';
  (this->_starting_items)._M_elems[6] = '\0';
  (this->_starting_items)._M_elems[7] = '\0';
  (this->_starting_items)._M_elems[8] = '\0';
  (this->_starting_items)._M_elems[9] = '\0';
  (this->_starting_items)._M_elems[10] = '\0';
  (this->_starting_items)._M_elems[0xb] = '\0';
  (this->_starting_items)._M_elems[0xc] = '\0';
  (this->_starting_items)._M_elems[0xd] = '\0';
  (this->_starting_items)._M_elems[0xe] = '\0';
  (this->_starting_items)._M_elems[0xf] = '\0';
  (this->_starting_items)._M_elems[0x10] = '\0';
  (this->_starting_items)._M_elems[0x11] = '\0';
  (this->_starting_items)._M_elems[0x12] = '\0';
  (this->_starting_items)._M_elems[0x13] = '\0';
  (this->_starting_items)._M_elems[0x14] = '\0';
  (this->_starting_items)._M_elems[0x15] = '\0';
  (this->_starting_items)._M_elems[0x16] = '\0';
  (this->_starting_items)._M_elems[0x17] = '\0';
  (this->_starting_items)._M_elems[0x18] = '\0';
  (this->_starting_items)._M_elems[0x19] = '\0';
  (this->_starting_items)._M_elems[0x1a] = '\0';
  (this->_starting_items)._M_elems[0x1b] = '\0';
  (this->_starting_items)._M_elems[0x1c] = '\0';
  (this->_starting_items)._M_elems[0x1d] = '\0';
  (this->_starting_items)._M_elems[0x1e] = '\0';
  (this->_starting_items)._M_elems[0x1f] = '\0';
  (this->_starting_items)._M_elems[0x20] = '\0';
  (this->_starting_items)._M_elems[0x21] = '\0';
  (this->_starting_items)._M_elems[0x22] = '\0';
  (this->_starting_items)._M_elems[0x23] = '\0';
  (this->_starting_items)._M_elems[0x24] = '\0';
  (this->_starting_items)._M_elems[0x25] = '\0';
  (this->_starting_items)._M_elems[0x26] = '\0';
  (this->_starting_items)._M_elems[0x27] = '\0';
  (this->_starting_items)._M_elems[0x28] = '\0';
  (this->_starting_items)._M_elems[0x29] = '\0';
  (this->_starting_items)._M_elems[0x2a] = '\0';
  (this->_starting_items)._M_elems[0x2b] = '\0';
  (this->_starting_items)._M_elems[0x2c] = '\0';
  (this->_starting_items)._M_elems[0x2d] = '\0';
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x30] = '\0';
  (this->_starting_items)._M_elems[0x31] = '\0';
  (this->_starting_items)._M_elems[0x32] = '\0';
  (this->_starting_items)._M_elems[0x33] = '\0';
  (this->_starting_items)._M_elems[0x34] = '\0';
  (this->_starting_items)._M_elems[0x35] = '\0';
  (this->_starting_items)._M_elems[0x36] = '\0';
  (this->_starting_items)._M_elems[0x37] = '\0';
  (this->_starting_items)._M_elems[0x38] = '\0';
  (this->_starting_items)._M_elems[0x39] = '\0';
  (this->_starting_items)._M_elems[0x3a] = '\0';
  (this->_starting_items)._M_elems[0x3b] = '\0';
  (this->_starting_items)._M_elems[0x3c] = '\0';
  (this->_starting_items)._M_elems[0x3d] = '\0';
  this->_fix_armlet_skip = true;
  this->_remove_tree_cutting_glitch_drops = true;
  this->_consumable_record_book = false;
  this->_consumable_spell_book = false;
  this->_remove_gumi_boulder = false;
  this->_remove_tibor_requirement = false;
  this->_all_trees_visited_at_start = false;
  this->_ekeeke_auto_revive = true;
  this->_enemies_damage_factor = 100;
  this->_enemies_health_factor = 100;
  this->_enemies_armor_factor = 100;
  this->_enemies_golds_factor = 100;
  this->_enemies_drop_chance_factor = 100;
  this->_health_gained_per_lifestock = '\x01';
  this->_fast_transitions = true;
  this->_archipelago_world = false;
  this->_seed = 0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_allow_spoiler_log = true;
  *(undefined8 *)
   ((long)&(this->_possible_spawn_locations).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_possible_spawn_locations).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_possible_spawn_locations).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_possible_spawn_locations).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->_shop_prices_factor = 100;
  this->_enemy_jumping_in_logic = false;
  this->_damage_boosting_in_logic = false;
  this->_tree_cutting_glitch_in_logic = false;
  this->_allow_whistle_usage_behind_trees = false;
  this->_ensure_ekeeke_in_shops = true;
  pJVar2 = &this->_world_json;
  (this->_world_json).m_type = null;
  (this->_world_json).m_value.object = (object_t *)0x0;
  (this->_items_distribution)._M_elems[0] = '\0';
  (this->_items_distribution)._M_elems[1] = '\0';
  (this->_items_distribution)._M_elems[2] = '\0';
  (this->_items_distribution)._M_elems[3] = '\0';
  (this->_items_distribution)._M_elems[4] = '\0';
  (this->_items_distribution)._M_elems[5] = '\0';
  (this->_items_distribution)._M_elems[6] = '\0';
  (this->_items_distribution)._M_elems[7] = '\0';
  (this->_items_distribution)._M_elems[8] = '\0';
  (this->_items_distribution)._M_elems[9] = '\0';
  (this->_items_distribution)._M_elems[10] = '\0';
  (this->_items_distribution)._M_elems[0xb] = '\0';
  (this->_items_distribution)._M_elems[0xc] = '\0';
  (this->_items_distribution)._M_elems[0xd] = '\0';
  (this->_items_distribution)._M_elems[0xe] = '\0';
  (this->_items_distribution)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x10] = '\0';
  (this->_items_distribution)._M_elems[0x11] = '\0';
  (this->_items_distribution)._M_elems[0x12] = '\0';
  (this->_items_distribution)._M_elems[0x13] = '\0';
  (this->_items_distribution)._M_elems[0x14] = '\0';
  (this->_items_distribution)._M_elems[0x15] = '\0';
  (this->_items_distribution)._M_elems[0x16] = '\0';
  (this->_items_distribution)._M_elems[0x17] = '\0';
  (this->_items_distribution)._M_elems[0x18] = '\0';
  (this->_items_distribution)._M_elems[0x19] = '\0';
  (this->_items_distribution)._M_elems[0x1a] = '\0';
  (this->_items_distribution)._M_elems[0x1b] = '\0';
  (this->_items_distribution)._M_elems[0x1c] = '\0';
  (this->_items_distribution)._M_elems[0x1d] = '\0';
  (this->_items_distribution)._M_elems[0x1e] = '\0';
  (this->_items_distribution)._M_elems[0x1f] = '\0';
  (this->_items_distribution)._M_elems[0x20] = '\0';
  (this->_items_distribution)._M_elems[0x21] = '\0';
  (this->_items_distribution)._M_elems[0x22] = '\0';
  (this->_items_distribution)._M_elems[0x23] = '\0';
  (this->_items_distribution)._M_elems[0x24] = '\0';
  (this->_items_distribution)._M_elems[0x25] = '\0';
  (this->_items_distribution)._M_elems[0x26] = '\0';
  (this->_items_distribution)._M_elems[0x27] = '\0';
  (this->_items_distribution)._M_elems[0x28] = '\0';
  (this->_items_distribution)._M_elems[0x29] = '\0';
  (this->_items_distribution)._M_elems[0x2a] = '\0';
  (this->_items_distribution)._M_elems[0x2b] = '\0';
  (this->_items_distribution)._M_elems[0x2c] = '\0';
  (this->_items_distribution)._M_elems[0x2d] = '\0';
  (this->_items_distribution)._M_elems[0x2e] = '\0';
  (this->_items_distribution)._M_elems[0x2f] = '\0';
  (this->_items_distribution)._M_elems[0x30] = '\0';
  (this->_items_distribution)._M_elems[0x31] = '\0';
  (this->_items_distribution)._M_elems[0x32] = '\0';
  (this->_items_distribution)._M_elems[0x33] = '\0';
  (this->_items_distribution)._M_elems[0x34] = '\0';
  (this->_items_distribution)._M_elems[0x35] = '\0';
  (this->_items_distribution)._M_elems[0x36] = '\0';
  (this->_items_distribution)._M_elems[0x37] = '\0';
  (this->_items_distribution)._M_elems[0x38] = '\0';
  (this->_items_distribution)._M_elems[0x39] = '\0';
  (this->_items_distribution)._M_elems[0x3a] = '\0';
  (this->_items_distribution)._M_elems[0x3b] = '\0';
  (this->_items_distribution)._M_elems[0x3c] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x40] = '\0';
  (this->_items_distribution)._M_elems[0x41] = '\0';
  (this->_items_distribution)._M_elems[0x42] = '\0';
  (this->_items_distribution)._M_elems[0x43] = '\0';
  (this->_items_distribution)._M_elems[0x44] = '\0';
  this->_filler_item = '\0';
  this->_hints_distribution_region_requirement = '\0';
  this->_hints_distribution_item_requirement = '\0';
  this->_hints_distribution_item_location = '\0';
  this->_hints_distribution_dark_region = '\0';
  this->_hints_distribution_joke = '\0';
  this->_christmas_event = false;
  this->_secret_event = false;
  local_2a0 = args;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  local_2a8 = pJVar2;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  pJVar2 = &this->_model_patch_items;
  (this->_model_patch_items).m_type = null;
  (this->_model_patch_items).m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  local_2b0 = pJVar2;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  pJVar2 = &this->_model_patch_spawns;
  (this->_model_patch_spawns).m_type = null;
  (this->_model_patch_spawns).m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  local_2b8 = pJVar2;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  pJVar2 = &this->_model_patch_hint_sources;
  (this->_model_patch_hint_sources).m_type = null;
  (this->_model_patch_hint_sources).m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  local_2c0 = pJVar2;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(pJVar2,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               *)this,&item_names->_M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_spawn_location_names,spawn_location_names);
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x30] = '\0';
  (this->_starting_items)._M_elems[0x31] = '\0';
  (this->_starting_items)._M_elems[0x32] = '\0';
  (this->_starting_items)._M_elems[0x33] = '\0';
  (this->_starting_items)._M_elems[0x34] = '\0';
  (this->_starting_items)._M_elems[0x35] = '\0';
  (this->_starting_items)._M_elems[0x36] = '\0';
  (this->_starting_items)._M_elems[0x37] = '\0';
  (this->_starting_items)._M_elems[0x38] = '\0';
  (this->_starting_items)._M_elems[0x39] = '\0';
  (this->_starting_items)._M_elems[0x3a] = '\0';
  (this->_starting_items)._M_elems[0x3b] = '\0';
  (this->_starting_items)._M_elems[0x3c] = '\0';
  (this->_starting_items)._M_elems[0x3d] = '\0';
  (this->_starting_items)._M_elems[0x20] = '\0';
  (this->_starting_items)._M_elems[0x21] = '\0';
  (this->_starting_items)._M_elems[0x22] = '\0';
  (this->_starting_items)._M_elems[0x23] = '\0';
  (this->_starting_items)._M_elems[0x24] = '\0';
  (this->_starting_items)._M_elems[0x25] = '\0';
  (this->_starting_items)._M_elems[0x26] = '\0';
  (this->_starting_items)._M_elems[0x27] = '\0';
  (this->_starting_items)._M_elems[0x28] = '\0';
  (this->_starting_items)._M_elems[0x29] = '\0';
  (this->_starting_items)._M_elems[0x2a] = '\0';
  (this->_starting_items)._M_elems[0x2b] = '\0';
  (this->_starting_items)._M_elems[0x2c] = '\0';
  (this->_starting_items)._M_elems[0x2d] = '\0';
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x10] = '\0';
  (this->_starting_items)._M_elems[0x11] = '\0';
  (this->_starting_items)._M_elems[0x12] = '\0';
  (this->_starting_items)._M_elems[0x13] = '\0';
  (this->_starting_items)._M_elems[0x14] = '\0';
  (this->_starting_items)._M_elems[0x15] = '\0';
  (this->_starting_items)._M_elems[0x16] = '\0';
  (this->_starting_items)._M_elems[0x17] = '\0';
  (this->_starting_items)._M_elems[0x18] = '\0';
  (this->_starting_items)._M_elems[0x19] = '\0';
  (this->_starting_items)._M_elems[0x1a] = '\0';
  (this->_starting_items)._M_elems[0x1b] = '\0';
  (this->_starting_items)._M_elems[0x1c] = '\0';
  (this->_starting_items)._M_elems[0x1d] = '\0';
  (this->_starting_items)._M_elems[0x1e] = '\0';
  (this->_starting_items)._M_elems[0x1f] = '\0';
  (this->_starting_items)._M_elems[0] = '\0';
  (this->_starting_items)._M_elems[1] = '\0';
  (this->_starting_items)._M_elems[2] = '\0';
  (this->_starting_items)._M_elems[3] = '\0';
  (this->_starting_items)._M_elems[4] = '\0';
  (this->_starting_items)._M_elems[5] = '\0';
  (this->_starting_items)._M_elems[6] = '\0';
  (this->_starting_items)._M_elems[7] = '\0';
  (this->_starting_items)._M_elems[8] = '\0';
  (this->_starting_items)._M_elems[9] = '\0';
  (this->_starting_items)._M_elems[10] = '\0';
  (this->_starting_items)._M_elems[0xb] = '\0';
  (this->_starting_items)._M_elems[0xc] = '\0';
  (this->_starting_items)._M_elems[0xd] = '\0';
  (this->_starting_items)._M_elems[0xe] = '\0';
  (this->_starting_items)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x30] = '\0';
  (this->_items_distribution)._M_elems[0x31] = '\0';
  (this->_items_distribution)._M_elems[0x32] = '\0';
  (this->_items_distribution)._M_elems[0x33] = '\0';
  (this->_items_distribution)._M_elems[0x34] = '\0';
  (this->_items_distribution)._M_elems[0x35] = '\0';
  (this->_items_distribution)._M_elems[0x36] = '\0';
  (this->_items_distribution)._M_elems[0x37] = '\0';
  (this->_items_distribution)._M_elems[0x38] = '\0';
  (this->_items_distribution)._M_elems[0x39] = '\0';
  (this->_items_distribution)._M_elems[0x3a] = '\0';
  (this->_items_distribution)._M_elems[0x3b] = '\0';
  (this->_items_distribution)._M_elems[0x3c] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x20] = '\0';
  (this->_items_distribution)._M_elems[0x21] = '\0';
  (this->_items_distribution)._M_elems[0x22] = '\0';
  (this->_items_distribution)._M_elems[0x23] = '\0';
  (this->_items_distribution)._M_elems[0x24] = '\0';
  (this->_items_distribution)._M_elems[0x25] = '\0';
  (this->_items_distribution)._M_elems[0x26] = '\0';
  (this->_items_distribution)._M_elems[0x27] = '\0';
  (this->_items_distribution)._M_elems[0x28] = '\0';
  (this->_items_distribution)._M_elems[0x29] = '\0';
  (this->_items_distribution)._M_elems[0x2a] = '\0';
  (this->_items_distribution)._M_elems[0x2b] = '\0';
  (this->_items_distribution)._M_elems[0x2c] = '\0';
  (this->_items_distribution)._M_elems[0x2d] = '\0';
  (this->_items_distribution)._M_elems[0x2e] = '\0';
  (this->_items_distribution)._M_elems[0x2f] = '\0';
  (this->_items_distribution)._M_elems[0x10] = '\0';
  (this->_items_distribution)._M_elems[0x11] = '\0';
  (this->_items_distribution)._M_elems[0x12] = '\0';
  (this->_items_distribution)._M_elems[0x13] = '\0';
  (this->_items_distribution)._M_elems[0x14] = '\0';
  (this->_items_distribution)._M_elems[0x15] = '\0';
  (this->_items_distribution)._M_elems[0x16] = '\0';
  (this->_items_distribution)._M_elems[0x17] = '\0';
  (this->_items_distribution)._M_elems[0x18] = '\0';
  (this->_items_distribution)._M_elems[0x19] = '\0';
  (this->_items_distribution)._M_elems[0x1a] = '\0';
  (this->_items_distribution)._M_elems[0x1b] = '\0';
  (this->_items_distribution)._M_elems[0x1c] = '\0';
  (this->_items_distribution)._M_elems[0x1d] = '\0';
  (this->_items_distribution)._M_elems[0x1e] = '\0';
  (this->_items_distribution)._M_elems[0x1f] = '\0';
  (this->_items_distribution)._M_elems[0] = '\0';
  (this->_items_distribution)._M_elems[1] = '\0';
  (this->_items_distribution)._M_elems[2] = '\0';
  (this->_items_distribution)._M_elems[3] = '\0';
  (this->_items_distribution)._M_elems[4] = '\0';
  (this->_items_distribution)._M_elems[5] = '\0';
  (this->_items_distribution)._M_elems[6] = '\0';
  (this->_items_distribution)._M_elems[7] = '\0';
  (this->_items_distribution)._M_elems[8] = '\0';
  (this->_items_distribution)._M_elems[9] = '\0';
  (this->_items_distribution)._M_elems[10] = '\0';
  (this->_items_distribution)._M_elems[0xb] = '\0';
  (this->_items_distribution)._M_elems[0xc] = '\0';
  (this->_items_distribution)._M_elems[0xd] = '\0';
  (this->_items_distribution)._M_elems[0xe] = '\0';
  (this->_items_distribution)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x40] = '\0';
  (this->_items_distribution)._M_elems[0x41] = '\0';
  (this->_items_distribution)._M_elems[0x42] = '\0';
  (this->_items_distribution)._M_elems[0x43] = '\0';
  (this->_items_distribution)._M_elems[0x44] = '\0';
  paVar3 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"permalink","");
  paVar12 = &local_308.field_2;
  local_308._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  this_00 = local_2a0;
  ArgumentDictionary::get_string(&local_258,local_2a0,&local_238,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar12) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_258._M_string_length == 0) {
    uVar6 = std::chrono::_V2::system_clock::now();
    this->_seed = uVar6;
    local_2e8 = &this->_spawn_location_names;
    local_238._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"preset","");
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
    ArgumentDictionary::get_string(&local_308,this_00,&local_238,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = local_308._M_dataplus._M_p;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<stringtools::ltrim(std::__cxx11::string&)::_lambda(int)_1_>>
                      (local_308._M_dataplus._M_p,
                       (char *)(local_308._M_string_length + (long)local_308._M_dataplus._M_p));
    sVar8 = (long)_Var15._M_p - (long)local_308._M_dataplus._M_p;
    if (local_308._M_dataplus._M_p + local_308._M_string_length == _Var7._M_current) {
      pcVar14 = local_308._M_dataplus._M_p + sVar8;
      local_308._M_string_length = sVar8;
    }
    else {
      lVar16 = (long)_Var7._M_current - (long)_Var15._M_p;
      if (((lVar16 != 0) &&
          ((undefined1 *)local_308._M_string_length != (undefined1 *)(sVar8 + lVar16))) &&
         (sVar13 = local_308._M_string_length - (long)(sVar8 + lVar16), sVar13 != 0)) {
        pcVar14 = local_308._M_dataplus._M_p + sVar8;
        if (sVar13 == 1) {
          *pcVar14 = pcVar14[lVar16];
        }
        else {
          memmove(pcVar14,pcVar14 + lVar16,sVar13);
        }
      }
      pcVar14 = local_308._M_dataplus._M_p + (local_308._M_string_length - lVar16);
      local_308._M_string_length = local_308._M_string_length - lVar16;
    }
    *pcVar14 = '\0';
    local_238._M_dataplus._M_p = local_308._M_dataplus._M_p + local_308._M_string_length;
    local_2e0._M_dataplus._M_p = local_308._M_dataplus._M_p;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<stringtools::rtrim(std::__cxx11::string&)::_lambda(int)_1_>>
              (&local_298);
    local_308._M_string_length =
         (size_type)(local_298._M_dataplus._M_p + -(long)local_308._M_dataplus._M_p);
    *local_298._M_dataplus._M_p = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_238._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"stdin","");
      bVar4 = ArgumentDictionary::get_boolean(this_00,&local_238,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar3) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please specify a preset name (name of a file inside the \'presets\' folder, leave empty for default): "
                   ,100);
        cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&local_308,cVar5);
        _Var15._M_p = local_308._M_dataplus._M_p;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<stringtools::ltrim(std::__cxx11::string&)::_lambda(int)_1_>>
                          (local_308._M_dataplus._M_p,
                           (char *)(local_308._M_string_length + (long)local_308._M_dataplus._M_p));
        sVar8 = (long)_Var15._M_p - (long)local_308._M_dataplus._M_p;
        if (local_308._M_dataplus._M_p + local_308._M_string_length == _Var7._M_current) {
          pcVar14 = local_308._M_dataplus._M_p + sVar8;
          local_308._M_string_length = sVar8;
        }
        else {
          lVar16 = (long)_Var7._M_current - (long)_Var15._M_p;
          if (((lVar16 != 0) &&
              ((undefined1 *)local_308._M_string_length != (undefined1 *)(sVar8 + lVar16))) &&
             (sVar13 = local_308._M_string_length - (long)(sVar8 + lVar16), sVar13 != 0)) {
            pcVar14 = local_308._M_dataplus._M_p + sVar8;
            if (sVar13 == 1) {
              *pcVar14 = pcVar14[lVar16];
            }
            else {
              memmove(pcVar14,pcVar14 + lVar16,sVar13);
            }
          }
          pcVar14 = local_308._M_dataplus._M_p + (local_308._M_string_length - lVar16);
          local_308._M_string_length = local_308._M_string_length - lVar16;
        }
        *pcVar14 = '\0';
        local_238._M_dataplus._M_p = local_308._M_dataplus._M_p + local_308._M_string_length;
        local_2e0._M_dataplus._M_p = local_308._M_dataplus._M_p;
        std::
        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<stringtools::rtrim(std::__cxx11::string&)::_lambda(int)_1_>>
                  (&local_298);
        local_308._M_string_length =
             (size_type)(local_298._M_dataplus._M_p + -(long)local_308._M_dataplus._M_p);
        *local_298._M_dataplus._M_p = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_308,0,0,"default",7);
      }
    }
    _Var15._M_p = local_308._M_dataplus._M_p;
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) ||
        (pvVar9 = memchr(local_308._M_dataplus._M_p,0x2f,local_308._M_string_length),
        pvVar9 == (void *)0x0)) || ((long)pvVar9 - (long)_Var15._M_p == -1)) {
      std::operator+(&local_238,"./presets/",&local_308);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_308,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar3) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
    local_238._M_dataplus._M_p = (pointer)local_308._M_string_length;
    local_238._M_string_length = (size_type)local_308._M_dataplus._M_p;
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,".json");
    if (!bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_308,".json");
    }
    std::ifstream::ifstream(&local_238,(string *)&local_308,_S_in);
    if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
      this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_298,"Could not open preset file at given path \'",&local_308);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_298,"\'");
      local_2e0._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar12 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p == paVar12) {
        local_2e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      }
      else {
        local_2e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2e0._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(this_01,&local_2e0);
      __cxa_throw(this_01,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"silent","");
    bVar4 = ArgumentDictionary::get_boolean(this_00,&local_2e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Preset: \'",9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                           local_308._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'\n",2);
    }
    local_2e0._M_dataplus._M_p = local_2e0._M_dataplus._M_p & 0xffffffffffffff00;
    local_2e0._M_string_length = 0;
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2e0,true);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2e0,true);
    nlohmann::operator>>
              ((istream *)&local_238,
               (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_2e0);
    parse_json(this,(Json *)&local_2e0);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2e0);
    std::ifstream::~ifstream(&local_238);
    _Var15._M_p = local_308._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p == paVar12) goto LAB_00186a96;
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + local_258._M_string_length);
    parse_permalink(this,&local_278);
    local_308.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
    _Var15._M_p = local_278._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p == &local_278.field_2) goto LAB_00186a96;
  }
  operator_delete(_Var15._M_p,local_308.field_2._M_allocated_capacity + 1);
LAB_00186a96:
  validate(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RandomizerOptions::RandomizerOptions(const ArgumentDictionary& args,
                                     const std::map<std::string, uint8_t>& item_names,
                                     const std::vector<std::string>& spawn_location_names)
{
    _item_names = item_names;
    _spawn_location_names = spawn_location_names;
    _starting_items.fill(0);
    _items_distribution.fill(0);

    std::string permalink_string = args.get_string("permalink");
    if(!permalink_string.empty())
    {
        // Permalink case: unpack it to find the preset and seed and generate the same world
        this->parse_permalink(permalink_string);
    }
    else
    {
        // Regular case: pick a random seed, read a preset file to get the config and generate a new world
        _seed = (uint32_t) std::chrono::system_clock::now().time_since_epoch().count();

        std::string preset_path = args.get_string("preset");
        stringtools::trim(preset_path);
        if(preset_path.empty())
        {
            if(args.get_boolean("stdin", true))
            {
                std::cout << "Please specify a preset name (name of a file inside the 'presets' folder, leave empty for default): ";
                std::getline(std::cin, preset_path);
                stringtools::trim(preset_path);
            }

            if(preset_path.empty())
                preset_path = "default";
        }

        // If a path was given, filter any kind of directories only keeping the last part of the path
        if(preset_path.find('/') == std::string::npos)
            preset_path = "./presets/" + preset_path;

        if(!preset_path.ends_with(".json"))
            preset_path += ".json";

        std::ifstream preset_file(preset_path);
        if(!preset_file)
            throw LandstalkerException("Could not open preset file at given path '" + preset_path + "'");

        if(!args.get_boolean("silent", false))
            std::cout << "Preset: '" << preset_path << "'\n";

        Json preset_json;
        preset_file >> preset_json;
        this->parse_json(preset_json);
    }

    this->validate();
}